

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w)

{
  undefined1 auVar1 [32];
  __m256i v;
  __m256i v_00;
  __m256i v_01;
  __m256i s1_00;
  __m256i s1_01;
  __m256i s1_02;
  __m256i s1_03;
  __m256i s1_04;
  __m256i s1_05;
  __m256i s1_06;
  __m256i s0_00;
  __m256i s0_01;
  __m256i s0_02;
  __m256i s0_03;
  __m256i s0_04;
  __m256i s0_05;
  __m256i s0_06;
  __m256i mask_base;
  __m256i mask_base_00;
  __m256i mask_base_01;
  __m256i mask_base_02;
  __m256i mask_base_03;
  __m256i mask_base_04;
  __m256i mask_base_05;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ushort uVar8;
  int in_ECX;
  void *in_RDX;
  longlong extraout_RDX;
  char in_SIL;
  void *a;
  void *in_RDI;
  void *in_R8;
  int in_R9D;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  void *a_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  __m128i v_02;
  uint in_stack_00000008;
  __m256i m8_3;
  __m256i m16H;
  __m256i m16L;
  __m256i s1H;
  __m256i s0H;
  __m256i s1L;
  __m256i s0L;
  __m256i s1;
  __m256i s0;
  int j;
  __m256i m8_2;
  __m256i m16BL;
  __m256i m16AL;
  __m256i s1BL;
  __m256i s1AL;
  __m256i s0BL;
  __m256i s0AL;
  __m128i s1B_2;
  __m128i s1A_2;
  __m128i s0B_2;
  __m128i s0A_2;
  __m256i m8_1;
  __m256i m16BD;
  __m256i m16AC;
  __m256i s1CD_w;
  __m256i s1AB_w;
  __m128i s1D_1;
  __m128i s1C_1;
  __m128i s1B_1;
  __m128i s1A_1;
  __m256i s0BD_w;
  __m256i s0AC_w;
  __m128i s0D_1;
  __m128i s0C_1;
  __m128i s0B_1;
  __m128i s0A_1;
  __m128i x_m8;
  __m256i m8;
  __m256i m16;
  __m256i s1ABCD_w;
  __m128i s1ABCD;
  __m128i s1CD;
  __m128i s1AB;
  __m128i s1D;
  __m128i s1C;
  __m128i s1B;
  __m128i s1A;
  __m256i s0ABCD_w;
  __m128i s0ABCD;
  __m128i s0CD;
  __m128i s0AB;
  __m128i s0D;
  __m128i s0C;
  __m128i s0B;
  __m128i s0A;
  int i;
  __m256i y_mask_base;
  int mb;
  undefined1 in_stack_fffffffffffff600 [24];
  undefined6 in_stack_fffffffffffff618;
  undefined8 in_stack_fffffffffffff620;
  undefined8 in_stack_fffffffffffff628;
  void *in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  longlong in_stack_fffffffffffff650;
  undefined8 in_stack_fffffffffffff658;
  undefined8 in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  longlong in_stack_fffffffffffff670;
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined4 local_484;
  undefined8 local_450;
  undefined8 local_440;
  undefined8 local_430;
  undefined1 local_2e0 [16];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_a0;
  undefined8 uStack_98;
  
  auVar21._8_8_ = uStack_2c8;
  auVar21._0_8_ = local_2d0;
  auVar11._8_8_ = in_stack_fffffffffffff668;
  auVar11._0_8_ = in_stack_fffffffffffff660;
  auVar12._8_8_ = in_stack_fffffffffffff648;
  auVar12._0_8_ = in_stack_fffffffffffff640;
  auVar13._8_8_ = in_stack_fffffffffffff658;
  auVar13._0_8_ = in_stack_fffffffffffff650;
  a = (void *)(ulong)in_stack_00000008;
  uVar8 = (ushort)(in_SIL == '\x01') * -0x40 + 0x26;
  auVar15 = vpinsrw_avx(ZEXT216(uVar8),(uint)uVar8,1);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,2);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,3);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,4);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,5);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,6);
  auVar15 = vpinsrw_avx(auVar15,(uint)uVar8,7);
  auVar10 = vpinsrw_avx(ZEXT216(uVar8),(uint)uVar8,1);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,2);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,3);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,4);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,5);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,6);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar8,7);
  auVar10 = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar10;
  auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
  local_484 = 0;
  local_450 = in_R8;
  local_440 = in_RDX;
  local_430 = in_RDI;
  auVar15 = auVar10;
  if (h == 4) {
    do {
      xx_loadl_32(local_440);
      auVar13 = auVar15;
      xx_loadl_32((void *)((long)local_440 + (long)in_ECX));
      auVar12 = auVar13;
      xx_loadl_32((void *)((long)local_440 + (long)(in_ECX * 2)));
      auVar11 = auVar12;
      xx_loadl_32((void *)((long)local_440 + (long)(in_ECX * 3)));
      auVar15 = vpunpckldq_avx(auVar15,auVar13);
      auVar13 = vpunpckldq_avx(auVar12,auVar11);
      auVar15 = vpunpcklqdq_avx(auVar15,auVar13);
      auVar1 = vpmovzxbw_avx2(auVar15);
      auVar11 = auVar1._0_16_;
      xx_loadl_32(local_450);
      auVar15 = auVar11;
      xx_loadl_32((void *)((long)local_450 + (long)in_R9D));
      auVar12 = auVar15;
      xx_loadl_32((void *)((long)local_450 + (long)(in_R9D * 2)));
      auVar13 = auVar12;
      xx_loadl_32((void *)((long)local_450 + (long)(in_R9D * 3)));
      auVar15 = vpunpckldq_avx(auVar11,auVar15);
      auVar13 = vpunpckldq_avx(auVar12,auVar13);
      auVar15 = vpunpcklqdq_avx(auVar15,auVar13);
      vpmovzxbw_avx2(auVar15);
      mask_base[1] = in_stack_fffffffffffff660;
      mask_base[0] = in_stack_fffffffffffff658;
      mask_base[2] = in_stack_fffffffffffff668;
      mask_base[3] = in_stack_fffffffffffff670;
      s0_00[1] = in_stack_fffffffffffff640;
      s0_00[0] = in_stack_fffffffffffff638;
      s0_00[2] = in_stack_fffffffffffff648;
      s0_00[3] = in_stack_fffffffffffff650;
      s1_00[0]._6_2_ = uVar8;
      s1_00[0]._0_6_ = in_stack_fffffffffffff618;
      s1_00[1] = in_stack_fffffffffffff620;
      s1_00[2] = in_stack_fffffffffffff628;
      s1_00[3] = (longlong)in_stack_fffffffffffff630;
      auVar15 = auVar19;
      auVar13 = auVar10;
      calc_mask_avx2(mask_base,s0_00,s1_00);
      auVar7._16_8_ = auVar15._0_8_;
      auVar7._0_16_ = auVar13;
      auVar7._24_8_ = auVar15._8_8_;
      auVar1 = vpackuswb_avx2(auVar7,ZEXT1632(ZEXT816(0)));
      auVar1 = vpermq_avx2(auVar1,0xd8);
      local_a0 = auVar1._0_8_;
      uStack_98 = auVar1._8_8_;
      v_02[1] = extraout_RDX;
      v_02[0] = (longlong)a;
      xx_storeu_128(local_430,v_02);
      auVar15._8_8_ = uStack_98;
      auVar15._0_8_ = local_a0;
      local_440 = (void *)((long)local_440 + (long)(in_ECX << 2));
      local_450 = (void *)((long)local_450 + (long)(in_R9D << 2));
      local_430 = (void *)((long)local_430 + 0x10);
      local_484 = local_484 + 4;
    } while (local_484 < (int)in_stack_00000008);
  }
  else {
    auVar14 = auVar10;
    if (h == 8) {
      do {
        xx_loadl_64(local_440);
        auVar13 = auVar14;
        xx_loadl_64((void *)((long)local_440 + (long)in_ECX));
        auVar15 = auVar13;
        xx_loadl_64((void *)((long)local_440 + (long)(in_ECX * 2)));
        auVar12 = auVar15;
        xx_loadl_64((void *)((long)local_440 + (long)(in_ECX * 3)));
        auVar15 = vpunpcklqdq_avx(auVar14,auVar15);
        vpmovzxbw_avx2(auVar15);
        auVar15 = vpunpcklqdq_avx(auVar13,auVar12);
        auVar1 = vpmovzxbw_avx2(auVar15);
        auVar11 = auVar1._0_16_;
        xx_loadl_64(local_450);
        auVar12 = auVar11;
        xx_loadl_64((void *)((long)local_450 + (long)in_R9D));
        auVar15 = auVar12;
        xx_loadl_64((void *)((long)local_450 + (long)(in_R9D * 2)));
        auVar13 = auVar15;
        xx_loadl_64((void *)((long)local_450 + (long)(in_R9D * 3)));
        auVar15 = vpunpcklqdq_avx(auVar11,auVar15);
        vpmovzxbw_avx2(auVar15);
        auVar15 = vpunpcklqdq_avx(auVar12,auVar13);
        vpmovzxbw_avx2(auVar15);
        mask_base_00[1] = in_stack_fffffffffffff660;
        mask_base_00[0] = in_stack_fffffffffffff658;
        mask_base_00[2] = in_stack_fffffffffffff668;
        mask_base_00[3] = in_stack_fffffffffffff670;
        s0_01[1] = in_stack_fffffffffffff640;
        s0_01[0] = in_stack_fffffffffffff638;
        s0_01[2] = in_stack_fffffffffffff648;
        s0_01[3] = in_stack_fffffffffffff650;
        s1_01[0]._6_2_ = uVar8;
        s1_01[0]._0_6_ = in_stack_fffffffffffff618;
        s1_01[1] = in_stack_fffffffffffff620;
        s1_01[2] = in_stack_fffffffffffff628;
        s1_01[3] = (longlong)in_stack_fffffffffffff630;
        auVar15 = auVar19;
        auVar12 = auVar10;
        calc_mask_avx2(mask_base_00,s0_01,s1_01);
        mask_base_01[1] = in_stack_fffffffffffff660;
        mask_base_01[0] = in_stack_fffffffffffff658;
        mask_base_01[2] = in_stack_fffffffffffff668;
        mask_base_01[3] = in_stack_fffffffffffff670;
        s0_02[1] = in_stack_fffffffffffff640;
        s0_02[0] = in_stack_fffffffffffff638;
        s0_02[2] = in_stack_fffffffffffff648;
        s0_02[3] = in_stack_fffffffffffff650;
        s1_02[0]._6_2_ = uVar8;
        s1_02[0]._0_6_ = in_stack_fffffffffffff618;
        s1_02[1] = in_stack_fffffffffffff620;
        s1_02[2] = in_stack_fffffffffffff628;
        s1_02[3] = (longlong)in_stack_fffffffffffff630;
        auVar13 = auVar19;
        auVar11 = auVar10;
        calc_mask_avx2(mask_base_01,s0_02,s1_02);
        uStack_728 = auVar15._8_8_;
        uStack_730 = auVar15._0_8_;
        auVar6._16_8_ = uStack_730;
        auVar6._0_16_ = auVar12;
        auVar6._24_8_ = uStack_728;
        auVar5._16_8_ = auVar13._0_8_;
        auVar5._0_16_ = auVar11;
        auVar5._24_8_ = auVar13._8_8_;
        auVar1 = vpackuswb_avx2(auVar6,auVar5);
        local_780 = auVar1._0_8_;
        uStack_778 = auVar1._8_8_;
        v[1] = in_stack_fffffffffffff600._0_8_;
        v[2] = in_stack_fffffffffffff600._8_8_;
        v[3] = in_stack_fffffffffffff600._16_8_;
        v[0] = 0xa2d2fe;
        yy_storeu_256(in_stack_fffffffffffff630,v);
        auVar14._8_8_ = uStack_778;
        auVar14._0_8_ = local_780;
        local_440 = (void *)((long)local_440 + (long)(in_ECX << 2));
        local_450 = (void *)((long)local_450 + (long)(in_R9D << 2));
        local_484 = local_484 + 4;
      } while (local_484 < (int)in_stack_00000008);
    }
    else {
      auVar20 = auVar19;
      auVar16 = auVar10;
      auVar17 = auVar10;
      if (h == 0x10) {
        do {
          xx_load_128(local_440);
          auVar15 = auVar16;
          xx_load_128((void *)((long)local_440 + (long)in_ECX));
          auVar13 = auVar15;
          xx_load_128(local_450);
          auVar12 = auVar13;
          xx_load_128((void *)((long)local_450 + (long)in_R9D));
          vpmovzxbw_avx2(auVar16);
          vpmovzxbw_avx2(auVar15);
          vpmovzxbw_avx2(auVar13);
          vpmovzxbw_avx2(auVar12);
          mask_base_02[1] = in_stack_fffffffffffff660;
          mask_base_02[0] = in_stack_fffffffffffff658;
          mask_base_02[2] = in_stack_fffffffffffff668;
          mask_base_02[3] = in_stack_fffffffffffff670;
          s0_03[1] = in_stack_fffffffffffff640;
          s0_03[0] = in_stack_fffffffffffff638;
          s0_03[2] = in_stack_fffffffffffff648;
          s0_03[3] = in_stack_fffffffffffff650;
          s1_03[0]._6_2_ = uVar8;
          s1_03[0]._0_6_ = in_stack_fffffffffffff618;
          s1_03[1] = in_stack_fffffffffffff620;
          s1_03[2] = in_stack_fffffffffffff628;
          s1_03[3] = (longlong)in_stack_fffffffffffff630;
          auVar15 = auVar19;
          auVar12 = auVar10;
          calc_mask_avx2(mask_base_02,s0_03,s1_03);
          mask_base_03[1] = in_stack_fffffffffffff660;
          mask_base_03[0] = in_stack_fffffffffffff658;
          mask_base_03[2] = in_stack_fffffffffffff668;
          mask_base_03[3] = in_stack_fffffffffffff670;
          s0_04[1] = in_stack_fffffffffffff640;
          s0_04[0] = in_stack_fffffffffffff638;
          s0_04[2] = in_stack_fffffffffffff648;
          s0_04[3] = in_stack_fffffffffffff650;
          s1_04[0]._6_2_ = uVar8;
          s1_04[0]._0_6_ = in_stack_fffffffffffff618;
          s1_04[1] = in_stack_fffffffffffff620;
          s1_04[2] = in_stack_fffffffffffff628;
          s1_04[3] = (longlong)in_stack_fffffffffffff630;
          auVar13 = auVar19;
          auVar11 = auVar10;
          calc_mask_avx2(mask_base_03,s0_04,s1_04);
          uStack_848 = auVar15._8_8_;
          uStack_850 = auVar15._0_8_;
          auVar4._16_8_ = uStack_850;
          auVar4._0_16_ = auVar12;
          auVar4._24_8_ = uStack_848;
          auVar3._16_8_ = auVar13._0_8_;
          auVar3._0_16_ = auVar11;
          auVar3._24_8_ = auVar13._8_8_;
          auVar1 = vpackuswb_avx2(auVar4,auVar3);
          auVar1 = vpermq_avx2(auVar1,0xd8);
          local_8a0 = auVar1._0_8_;
          uStack_898 = auVar1._8_8_;
          v_00[1] = in_stack_fffffffffffff600._0_8_;
          v_00[2] = in_stack_fffffffffffff600._8_8_;
          v_00[3] = in_stack_fffffffffffff600._16_8_;
          v_00[0] = 0xa2d53e;
          yy_storeu_256(in_stack_fffffffffffff630,v_00);
          auVar16._8_8_ = uStack_898;
          auVar16._0_8_ = local_8a0;
          local_440 = (void *)((long)local_440 + (long)(in_ECX << 1));
          local_450 = (void *)((long)local_450 + (long)(in_R9D << 1));
          local_484 = local_484 + 2;
        } while (local_484 < (int)in_stack_00000008);
      }
      else {
        do {
          local_8a4 = 0;
          auVar15 = auVar21;
          do {
            yy_loadu_256((__m256i *)((long)local_440 + (long)local_8a4),a);
            auVar21 = auVar20;
            auVar14 = auVar17;
            yy_loadu_256((__m256i *)((long)local_450 + (long)local_8a4),a);
            vpmovzxbw_avx2(auVar17);
            vpmovzxbw_avx2(auVar14);
            vpmovzxbw_avx2(auVar15);
            vpmovzxbw_avx2(local_2e0);
            mask_base_04[1] = auVar11._0_8_;
            mask_base_04[0] = auVar13._8_8_;
            mask_base_04[2] = auVar11._8_8_;
            mask_base_04[3] = in_stack_fffffffffffff670;
            s0_05[1] = auVar12._0_8_;
            s0_05[0] = in_stack_fffffffffffff638;
            s0_05[2] = auVar12._8_8_;
            s0_05[3] = auVar13._0_8_;
            s1_05[0]._6_2_ = uVar8;
            s1_05[0]._0_6_ = in_stack_fffffffffffff618;
            s1_05[1] = in_stack_fffffffffffff620;
            s1_05[2] = in_stack_fffffffffffff628;
            s1_05[3] = (longlong)in_stack_fffffffffffff630;
            auVar15 = auVar19;
            auVar11 = auVar10;
            calc_mask_avx2(mask_base_04,s0_05,s1_05);
            in_stack_fffffffffffff670 = auVar15._0_8_;
            mask_base_05[1] = auVar11._0_8_;
            mask_base_05[0] = auVar13._8_8_;
            mask_base_05[2] = auVar11._8_8_;
            mask_base_05[3] = in_stack_fffffffffffff670;
            s0_06[1] = auVar12._0_8_;
            s0_06[0] = in_stack_fffffffffffff638;
            s0_06[2] = auVar12._8_8_;
            s0_06[3] = auVar13._0_8_;
            s1_06[0]._6_2_ = uVar8;
            s1_06[0]._0_6_ = in_stack_fffffffffffff618;
            s1_06[1] = in_stack_fffffffffffff620;
            s1_06[2] = in_stack_fffffffffffff628;
            s1_06[3] = (longlong)in_stack_fffffffffffff630;
            auVar13 = auVar19;
            auVar12 = auVar10;
            calc_mask_avx2(mask_base_05,s0_06,s1_06);
            auVar2._16_8_ = in_stack_fffffffffffff670;
            auVar2._0_16_ = auVar11;
            auVar2._24_8_ = auVar15._8_8_;
            auVar1._16_8_ = auVar13._0_8_;
            auVar1._0_16_ = auVar12;
            auVar1._24_8_ = auVar13._8_8_;
            auVar1 = vpackuswb_avx2(auVar2,auVar1);
            auVar1 = vpermq_avx2(auVar1,0xd8);
            uVar9 = auVar1._0_8_;
            uVar18 = auVar1._8_8_;
            a_00 = auVar1._16_8_;
            uVar22 = auVar1._24_8_;
            v_01[1] = in_stack_fffffffffffff600._0_8_;
            v_01[2] = in_stack_fffffffffffff600._8_8_;
            v_01[3] = in_stack_fffffffffffff600._16_8_;
            v_01[0] = 0xa2d76b;
            in_stack_fffffffffffff620 = uVar9;
            in_stack_fffffffffffff628 = uVar18;
            in_stack_fffffffffffff630 = a_00;
            in_stack_fffffffffffff638 = uVar22;
            yy_storeu_256(a_00,v_01);
            auVar17._8_8_ = uVar18;
            auVar17._0_8_ = uVar9;
            auVar20._8_8_ = uVar22;
            auVar20._0_8_ = a_00;
            local_8a4 = local_8a4 + 0x20;
            auVar15 = auVar21;
          } while (local_8a4 < h);
          local_440 = (void *)((long)local_440 + (long)in_ECX);
          local_450 = (void *)((long)local_450 + (long)in_R9D);
          local_484 = local_484 + 1;
        } while (local_484 < (int)in_stack_00000008);
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_avx2(uint8_t *mask,
                                          DIFFWTD_MASK_TYPE mask_type,
                                          const uint8_t *src0, int src0_stride,
                                          const uint8_t *src1, int src1_stride,
                                          int h, int w) {
  const int mb = (mask_type == DIFFWTD_38_INV) ? AOM_BLEND_A64_MAX_ALPHA : 0;
  const __m256i y_mask_base = _mm256_set1_epi16(38 - mb);
  int i = 0;
  if (4 == w) {
    do {
      const __m128i s0A = xx_loadl_32(src0);
      const __m128i s0B = xx_loadl_32(src0 + src0_stride);
      const __m128i s0C = xx_loadl_32(src0 + src0_stride * 2);
      const __m128i s0D = xx_loadl_32(src0 + src0_stride * 3);
      const __m128i s0AB = _mm_unpacklo_epi32(s0A, s0B);
      const __m128i s0CD = _mm_unpacklo_epi32(s0C, s0D);
      const __m128i s0ABCD = _mm_unpacklo_epi64(s0AB, s0CD);
      const __m256i s0ABCD_w = _mm256_cvtepu8_epi16(s0ABCD);

      const __m128i s1A = xx_loadl_32(src1);
      const __m128i s1B = xx_loadl_32(src1 + src1_stride);
      const __m128i s1C = xx_loadl_32(src1 + src1_stride * 2);
      const __m128i s1D = xx_loadl_32(src1 + src1_stride * 3);
      const __m128i s1AB = _mm_unpacklo_epi32(s1A, s1B);
      const __m128i s1CD = _mm_unpacklo_epi32(s1C, s1D);
      const __m128i s1ABCD = _mm_unpacklo_epi64(s1AB, s1CD);
      const __m256i s1ABCD_w = _mm256_cvtepu8_epi16(s1ABCD);
      const __m256i m16 = calc_mask_avx2(y_mask_base, s0ABCD_w, s1ABCD_w);
      const __m256i m8 = _mm256_packus_epi16(m16, _mm256_setzero_si256());
      const __m128i x_m8 =
          _mm256_castsi256_si128(_mm256_permute4x64_epi64(m8, 0xd8));
      xx_storeu_128(mask, x_m8);
      src0 += (src0_stride << 2);
      src1 += (src1_stride << 2);
      mask += 16;
      i += 4;
    } while (i < h);
  } else if (8 == w) {
    do {
      const __m128i s0A = xx_loadl_64(src0);
      const __m128i s0B = xx_loadl_64(src0 + src0_stride);
      const __m128i s0C = xx_loadl_64(src0 + src0_stride * 2);
      const __m128i s0D = xx_loadl_64(src0 + src0_stride * 3);
      const __m256i s0AC_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s0A, s0C));
      const __m256i s0BD_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s0B, s0D));
      const __m128i s1A = xx_loadl_64(src1);
      const __m128i s1B = xx_loadl_64(src1 + src1_stride);
      const __m128i s1C = xx_loadl_64(src1 + src1_stride * 2);
      const __m128i s1D = xx_loadl_64(src1 + src1_stride * 3);
      const __m256i s1AB_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s1A, s1C));
      const __m256i s1CD_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s1B, s1D));
      const __m256i m16AC = calc_mask_avx2(y_mask_base, s0AC_w, s1AB_w);
      const __m256i m16BD = calc_mask_avx2(y_mask_base, s0BD_w, s1CD_w);
      const __m256i m8 = _mm256_packus_epi16(m16AC, m16BD);
      yy_storeu_256(mask, m8);
      src0 += src0_stride << 2;
      src1 += src1_stride << 2;
      mask += 32;
      i += 4;
    } while (i < h);
  } else if (16 == w) {
    do {
      const __m128i s0A = xx_load_128(src0);
      const __m128i s0B = xx_load_128(src0 + src0_stride);
      const __m128i s1A = xx_load_128(src1);
      const __m128i s1B = xx_load_128(src1 + src1_stride);
      const __m256i s0AL = _mm256_cvtepu8_epi16(s0A);
      const __m256i s0BL = _mm256_cvtepu8_epi16(s0B);
      const __m256i s1AL = _mm256_cvtepu8_epi16(s1A);
      const __m256i s1BL = _mm256_cvtepu8_epi16(s1B);

      const __m256i m16AL = calc_mask_avx2(y_mask_base, s0AL, s1AL);
      const __m256i m16BL = calc_mask_avx2(y_mask_base, s0BL, s1BL);

      const __m256i m8 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(m16AL, m16BL), 0xd8);
      yy_storeu_256(mask, m8);
      src0 += src0_stride << 1;
      src1 += src1_stride << 1;
      mask += 32;
      i += 2;
    } while (i < h);
  } else {
    do {
      int j = 0;
      do {
        const __m256i s0 = yy_loadu_256(src0 + j);
        const __m256i s1 = yy_loadu_256(src1 + j);
        const __m256i s0L = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(s0));
        const __m256i s1L = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(s1));
        const __m256i s0H =
            _mm256_cvtepu8_epi16(_mm256_extracti128_si256(s0, 1));
        const __m256i s1H =
            _mm256_cvtepu8_epi16(_mm256_extracti128_si256(s1, 1));
        const __m256i m16L = calc_mask_avx2(y_mask_base, s0L, s1L);
        const __m256i m16H = calc_mask_avx2(y_mask_base, s0H, s1H);
        const __m256i m8 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(m16L, m16H), 0xd8);
        yy_storeu_256(mask + j, m8);
        j += 32;
      } while (j < w);
      src0 += src0_stride;
      src1 += src1_stride;
      mask += w;
      i += 1;
    } while (i < h);
  }
}